

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O3

double log(double __x)

{
  char in_AL;
  char *in_RSI;
  byte in_DIL;
  double extraout_XMM0_Qa;
  va_list args;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [48];
  double local_98;
  
  if (in_AL != '\0') {
    local_98 = __x;
  }
  if (((afl_debug_enabled != 0) || ((afl_debug_unicorn_enabled & 1) != 0)) &&
     ((byte)((afl_debug_enabled | in_DIL) & (in_DIL ^ 1 | afl_debug_unicorn_enabled)) == 1)) {
    fwrite("[u] ",4,1,_stderr);
    if (afl_debug_enabled == 1) {
      log();
    }
    if ((in_DIL != 0) && (afl_debug_unicorn_enabled == 1)) {
      log();
    }
    local_d8 = local_c8;
    local_e0 = &args[0].overflow_arg_area;
    local_e8 = 0x3000000010;
    vfprintf(_stderr,in_RSI,&local_e8);
    __x = extraout_XMM0_Qa;
  }
  return __x;
}

Assistant:

static void log(bool in_child, const char* fmt, ...) {
    va_list args;

    if (likely(!afl_debug_enabled && !afl_debug_unicorn_enabled)) {
        return;
    }

    if (in_child && !afl_debug_unicorn_enabled) {
        return;
    }

    if (!in_child && !afl_debug_enabled) {
        return;
    }

    fprintf(stderr, "[u] ");

    if (afl_debug_enabled) {
        auto n = std::chrono::steady_clock::now();

        fprintf(
            stderr, "[%04.6f] ",
            std::chrono::duration_cast<std::chrono::duration<double>>(n - t0)
                .count());
    }

    if (in_child && afl_debug_unicorn_enabled) {
        pid_t p = getpid();

        fprintf(stderr, "[%04" PRId32 "] ", p);
    }

    va_start(args, fmt);

    vfprintf(stderr, fmt, args);

    va_end(args);
}